

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

bool __thiscall
libcellml::Generator::GeneratorImpl::isToBeComputedAgain
          (GeneratorImpl *this,AnalyserEquationPtr *equation)

{
  Type TVar1;
  element_type *peVar2;
  AnalyserEquationPtr *equation_local;
  GeneratorImpl *this_local;
  
  peVar2 = std::
           __shared_ptr_access<libcellml::AnalyserEquation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::AnalyserEquation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)equation);
  TVar1 = AnalyserEquation::type(peVar2);
  if (TVar1 - NLA < 2) {
    peVar2 = std::
             __shared_ptr_access<libcellml::AnalyserEquation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::AnalyserEquation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)equation);
    this_local._7_1_ = AnalyserEquation::isStateRateBased(peVar2);
  }
  else if (TVar1 == EXTERNAL) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Generator::GeneratorImpl::isToBeComputedAgain(const AnalyserEquationPtr &equation) const
{
    // NLA and algebraic equations that are state/rate-based and external
    // equations are to be computed again (in the computeVariables() method).

    switch (equation->type()) {
    case AnalyserEquation::Type::NLA:
    case AnalyserEquation::Type::ALGEBRAIC:
        return equation->isStateRateBased();
    case AnalyserEquation::Type::EXTERNAL:
        return true;
    default:
        return false;
    }
}